

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void recmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  int p_00;
  ulong uVar5;
  int p_01;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  uint n_00;
  ulong uVar9;
  double dVar10;
  double *local_48;
  uint local_3c;
  
  uVar5 = (ulong)(uint)p;
  uVar9 = (ulong)(uint)n;
  iVar1 = n + m;
  local_48 = B;
  if (0xc0 < iVar1 + p) {
    local_3c = n;
    if (n < m) {
      local_3c = m;
    }
    do {
      while( true ) {
        n_00 = (uint)uVar9;
        p_00 = (int)uVar5;
        if (((int)n_00 <= m) && (p_00 <= m)) break;
        if (((int)n_00 < m) || ((int)n_00 < p_00)) {
          if (p_00 < (int)local_3c) {
            return;
          }
          dVar10 = ceil((double)p_00 * 0.5);
          p_01 = (int)dVar10;
          recmult(A,local_48,C,m,n_00,p_01,sA,sB,sC);
          lVar2 = (long)p_01;
          C = C + lVar2;
          uVar5 = (ulong)(uint)(p_00 - p_01);
        }
        else {
          dVar10 = ceil((double)(int)n_00 * 0.5);
          iVar1 = (int)dVar10;
          recmult(A,local_48,C,m,iVar1,p_00,sA,sB,sC);
          A = A + iVar1;
          local_3c = n_00 - iVar1;
          uVar9 = (ulong)local_3c;
          lVar2 = (long)(iVar1 * sC);
          iVar1 = local_3c + m;
          if ((int)local_3c < m) {
            local_3c = m;
          }
        }
        local_48 = local_48 + lVar2;
        if (iVar1 + (int)uVar5 < 0xc1) goto LAB_0011b7fc;
      }
      dVar10 = ceil((double)m * 0.5);
      iVar1 = (int)dVar10;
      recmult(A,local_48,C,iVar1,n_00,p_00,sA,sB,sC);
      A = A + iVar1 * sB;
      m = m - iVar1;
      C = C + iVar1 * sC;
      iVar1 = n_00 + m;
      local_3c = n_00;
      if ((int)n_00 < m) {
        local_3c = m;
      }
    } while (0xc0 < iVar1 + p_00);
  }
LAB_0011b7fc:
  if (0 < m) {
    uVar6 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar8 = 0;
        pdVar4 = local_48;
        do {
          if (0 < (int)uVar9) {
            lVar2 = uVar8 + uVar6 * (long)sC;
            dVar10 = C[lVar2];
            uVar3 = 0;
            pdVar7 = pdVar4;
            do {
              dVar10 = dVar10 + A[uVar3] * *pdVar7;
              C[lVar2] = dVar10;
              uVar3 = uVar3 + 1;
              pdVar7 = pdVar7 + sC;
            } while (uVar9 != uVar3);
          }
          uVar8 = uVar8 + 1;
          pdVar4 = pdVar4 + 1;
        } while (uVar8 != uVar5);
      }
      uVar6 = uVar6 + 1;
      A = A + sB;
    } while (uVar6 != (uint)m);
  }
  return;
}

Assistant:

void recmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	int m2,n2,p2;
	register int i,j,k;
	int u,v,t;
	if (m + n + p <= CUTOFF) {
		//#pragma omp parallel for private(i,j,k,v,u,t)
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sB;
				u = i * sC;
				t = j + u;
				for (k = 0; k < n;++k) {
					C[t] += A[k + v] * B[j + k * sC];
				}
			}
		}

		
	} else if (m >= n && m >= p) {
		m2 = (int) ceil((double) m / 2.0);
		recmult(A,B,C,m2,n,p,sA,sB,sC);
		recmult(A + m2*sB,B,C + m2*sC,m-m2,n,p,sA,sB,sC);
		
	} else if (n >= m && n >= p) {
		n2 = (int) ceil((double) n / 2.0);
		recmult(A,B,C,m,n2,p,sA,sB,sC);
		recmult(A+n2,B+n2*sC,C,m,n-n2,p,sA,sB,sC);
		
	} else if (p >= m && p >= n) {
		p2 = (int) ceil((double) p / 2.0);
		recmult(A,B,C,m,n,p2,sA,sB,sC);
		recmult(A,B+p2,C+p2,m,n,p-p2,sA,sB,sC);
	}
}